

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O3

FILE * read_stdin(void)

{
  return _stdin;
}

Assistant:

GLOBAL(FILE *)
read_stdin(void)
{
  FILE *input_file = stdin;

#ifdef USE_SETMODE              /* need to hack file mode? */
  setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
  if ((input_file = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
    fprintf(stderr, "Cannot reopen stdin\n");
    exit(EXIT_FAILURE);
  }
#endif
  return input_file;
}